

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary.cpp
# Opt level: O0

int __thiscall CBoundary::AddPenalty(CBoundary *this,int iPenalty)

{
  int iPenalty_local;
  CBoundary *this_local;
  
  (this->super_CPoint).super_CObject.m_iProp =
       (int)((double)(this->super_CPoint).super_CObject.m_iProp +
            (double)(iPenalty * (int)this->m_iCongestion * (int)this->m_iCongestion) / 10000.0);
  return (this->super_CPoint).super_CObject.m_iProp;
}

Assistant:

int CBoundary::AddPenalty(int iPenalty)
{
	//if(iPenalty<0)
	//{
	//	m_iProp	=	0;
	//	if(GetOverFlow())
	//	{
	//		double	dPenalty	=	0;
	//		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
	//		{
	//			dPenalty	+=	(*itr)->GetParent()->m_fPenalty;
	//		}
	//		m_iProp	=	dPenalty;
	//	}
	//}
	//else
	//{
		m_iProp	+=	iPenalty*SQRE(m_iCongestion)/10000.0;
	//}

	return	m_iProp;
}